

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O1

code_point_t onmt::unicode::utf8_to_cp(char *str,size_t *length)

{
  byte bVar1;
  ulong uVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  
  bVar1 = *str;
  uVar2 = 1;
  if (-1 < (char)bVar1) {
    uVar3 = (uint)bVar1;
    goto LAB_001b9b9a;
  }
  if (bVar1 < 0xe0) {
    uVar3 = 0xffffffff;
    if (bVar1 < 0xc2) goto LAB_001b9b9a;
    uVar5 = bVar1 & 0x1f;
    uVar2 = 1;
  }
  else {
    if (bVar1 < 0xf0) {
      uVar3 = bVar1 & 0xf;
      if (((byte)" 000000000000\x1000"[uVar3] >> ((byte)str[1] >> 5) & 1) == 0) {
        uVar3 = 0xffffffff;
        goto LAB_001b9b9a;
      }
      bVar4 = str[1] & 0x3f;
      uVar2 = 2;
    }
    else {
      uVar3 = 0xffffffff;
      if (0xf4 < bVar1) goto LAB_001b9b9a;
      if (((uint)(int)""[(byte)str[1] >> 4] >> (bVar1 - 0xf0 & 0x1f) & 1) == 0) goto LAB_001b9b9a;
      bVar4 = str[2] + 0x80;
      uVar2 = 2;
      if (0x3f < bVar4) goto LAB_001b9b9a;
      uVar3 = (byte)str[1] & 0x3f | (bVar1 - 0xf0) * 0x40;
      uVar2 = 3;
    }
    uVar5 = (uint)bVar4 | uVar3 << 6;
  }
  uVar3 = 0xffffffff;
  if ((byte)((byte)str[uVar2] ^ 0x80) < 0x40) {
    uVar3 = uVar5 << 6 | (byte)str[uVar2] ^ 0x80;
    uVar2 = (ulong)((int)uVar2 + 1);
  }
LAB_001b9b9a:
  if (length != (size_t *)0x0) {
    if ((int)uVar3 < 0) {
      uVar2 = 0;
    }
    *length = uVar2;
  }
  uVar5 = 0;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  return uVar5;
}

Assistant:

code_point_t utf8_to_cp(const char* str, size_t* length)
    {
      UChar32 c = -1;
      int32_t offset = 0;
      U8_NEXT(str, offset, -1, c);
      if (c < 0)
      {
        c = 0;
        offset = 0;
      }
      if (length)
        *length = offset;
      return c;
    }